

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall
geemuboi::test::core::CpuTest_add_hl_hl_half_carry_and_carry_Test::TestBody
          (CpuTest_add_hl_hl_half_carry_and_carry_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Registers expected_regs;
  Message local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Registers local_18;
  
  (this->super_CpuTest).regs.f = 0x80;
  (this->super_CpuTest).regs.h = 0xff;
  (this->super_CpuTest).regs.l = 0xff;
  CpuTest::execute_instruction(&this->super_CpuTest,')');
  local_18.a = '\0';
  local_18.b = '\0';
  local_18.c = '\0';
  local_18.d = '\0';
  local_18.e = '\0';
  local_18.h = 0xff;
  local_18.l = 0xfe;
  local_18.f = 0xb0;
  local_18.pc = 1;
  local_18.sp = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,&local_18);
  local_38.ss_.ptr_._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_30.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_28,"cpu->get_cycles_executed()","2",(uint *)&local_38,(int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x382,message);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_38.ss_.ptr_._4_4_,(int)local_38.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_hl_half_carry_and_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xFF;
    regs.l = 0xFF;
    execute_instruction(0x29);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0xFF;
    expected_regs.l = 0xFE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}